

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> *
mxx::all2all<unsigned_long>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          unsigned_long *msgs,size_t size,comm *comm)

{
  comm *size_00;
  size_t msgs_00;
  int iVar1;
  reference out;
  allocator<unsigned_long> local_2a;
  undefined1 local_29;
  comm *local_28;
  comm *comm_local;
  size_t size_local;
  unsigned_long *msgs_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *result;
  
  local_29 = 0;
  local_28 = comm;
  comm_local = (comm *)size;
  size_local = (size_t)msgs;
  msgs_local = (unsigned_long *)__return_storage_ptr__;
  iVar1 = mxx::comm::size(comm);
  std::allocator<unsigned_long>::allocator(&local_2a);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (__return_storage_ptr__,size * (long)iVar1,&local_2a);
  std::allocator<unsigned_long>::~allocator(&local_2a);
  msgs_00 = size_local;
  size_00 = comm_local;
  out = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                  (__return_storage_ptr__,0);
  all2all<unsigned_long>((unsigned_long *)msgs_00,(size_t)size_00,out,local_28);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> all2all(const T* msgs, size_t size, const mxx::comm& comm = mxx::comm()) {
    std::vector<T> result(size*comm.size());
    all2all(msgs, size, &result[0], comm);
    return result;
}